

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.hpp
# Opt level: O2

ShaderCodeVariableDescX * __thiscall
Diligent::ShaderCodeVariableDescX::operator=
          (ShaderCodeVariableDescX *this,ShaderCodeVariableDescX *RHS)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Uint32 UVar5;
  Uint32 UVar6;
  Uint32 UVar7;
  SHADER_CODE_BASIC_TYPE SVar8;
  Uint8 UVar9;
  Uint8 UVar10;
  
  (this->super_ShaderCodeVariableDesc).pMembers = (RHS->super_ShaderCodeVariableDesc).pMembers;
  uVar1 = *(undefined4 *)&(RHS->super_ShaderCodeVariableDesc).Name;
  uVar2 = *(undefined4 *)((long)&(RHS->super_ShaderCodeVariableDesc).Name + 4);
  uVar3 = *(undefined4 *)&(RHS->super_ShaderCodeVariableDesc).TypeName;
  uVar4 = *(undefined4 *)((long)&(RHS->super_ShaderCodeVariableDesc).TypeName + 4);
  SVar8 = (RHS->super_ShaderCodeVariableDesc).BasicType;
  UVar9 = (RHS->super_ShaderCodeVariableDesc).NumRows;
  UVar10 = (RHS->super_ShaderCodeVariableDesc).NumColumns;
  UVar5 = (RHS->super_ShaderCodeVariableDesc).Offset;
  UVar6 = (RHS->super_ShaderCodeVariableDesc).ArraySize;
  UVar7 = (RHS->super_ShaderCodeVariableDesc).NumMembers;
  (this->super_ShaderCodeVariableDesc).Class = (RHS->super_ShaderCodeVariableDesc).Class;
  (this->super_ShaderCodeVariableDesc).BasicType = SVar8;
  (this->super_ShaderCodeVariableDesc).NumRows = UVar9;
  (this->super_ShaderCodeVariableDesc).NumColumns = UVar10;
  (this->super_ShaderCodeVariableDesc).Offset = UVar5;
  (this->super_ShaderCodeVariableDesc).ArraySize = UVar6;
  (this->super_ShaderCodeVariableDesc).NumMembers = UVar7;
  *(undefined4 *)&(this->super_ShaderCodeVariableDesc).Name = uVar1;
  *(undefined4 *)((long)&(this->super_ShaderCodeVariableDesc).Name + 4) = uVar2;
  *(undefined4 *)&(this->super_ShaderCodeVariableDesc).TypeName = uVar3;
  *(undefined4 *)((long)&(this->super_ShaderCodeVariableDesc).TypeName + 4) = uVar4;
  std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ::_M_move_assign(&this->Members,&RHS->Members);
  std::__cxx11::string::operator=((string *)&this->NameCopy,(string *)&RHS->NameCopy);
  std::__cxx11::string::operator=((string *)&this->TypeNameCopy,(string *)&RHS->TypeNameCopy);
  (this->super_ShaderCodeVariableDesc).Name = (this->NameCopy)._M_dataplus._M_p;
  (this->super_ShaderCodeVariableDesc).TypeName = (this->TypeNameCopy)._M_dataplus._M_p;
  (this->super_ShaderCodeVariableDesc).pMembers =
       &((this->Members).
         super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
         ._M_impl.super__Vector_impl_data._M_start)->super_ShaderCodeVariableDesc;
  return this;
}

Assistant:

ShaderCodeVariableDescX& operator=(ShaderCodeVariableDescX&& RHS) noexcept
    {
        static_cast<ShaderCodeVariableDesc&>(*this) = RHS;

        Members      = std::move(RHS.Members);
        NameCopy     = std::move(RHS.NameCopy);
        TypeNameCopy = std::move(RHS.TypeNameCopy);

        Name     = NameCopy.c_str();
        TypeName = TypeNameCopy.c_str();
        pMembers = Members.data();

        return *this;
    }